

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request_body.c
# Opt level: O0

ngx_int_t ngx_http_discard_request_body(ngx_http_request_t *r)

{
  ngx_event_t *ev;
  ngx_int_t nVar1;
  ngx_event_t *rev;
  ngx_int_t rc;
  ssize_t size;
  ngx_http_request_t *r_local;
  
  if (((r == r->main) && ((*(ulong *)&r->field_0x468 >> 0xc & 1) == 0)) &&
     (r->request_body == (ngx_http_request_body_t *)0x0)) {
    nVar1 = ngx_http_test_expect(r);
    if (nVar1 == 0) {
      ev = r->connection->read;
      if ((ev->log->log_level & 0x100) != 0) {
        ngx_log_error_core(8,ev->log,0,"http set discard body");
      }
      if ((*(uint *)&ev->field_0x8 >> 0xb & 1) != 0) {
        ngx_event_del_timer(ev);
      }
      if (((r->headers_in).content_length_n < 1) &&
         ((*(ushort *)&(r->headers_in).field_0x168 >> 2 & 1) == 0)) {
        r_local = (ngx_http_request_t *)0x0;
      }
      else {
        if ((r->header_in->last != r->header_in->pos) ||
           ((*(ushort *)&(r->headers_in).field_0x168 >> 2 & 1) != 0)) {
          nVar1 = ngx_http_discard_request_body_filter(r,r->header_in);
          if (nVar1 != 0) {
            return nVar1;
          }
          if ((r->headers_in).content_length_n == 0) {
            return 0;
          }
        }
        r_local = (ngx_http_request_t *)ngx_http_read_discarded_request_body(r);
        if (r_local == (ngx_http_request_t *)0x0) {
          *(ulong *)&r->field_0x468 = *(ulong *)&r->field_0x468 & 0xfffffffffffff7ff;
          r_local = (ngx_http_request_t *)0x0;
        }
        else if ((long)r_local < 300) {
          r->read_event_handler = ngx_http_discarded_request_body_handler;
          nVar1 = ngx_handle_read_event(ev,0);
          if (nVar1 == 0) {
            *(ulong *)&r->field_0x460 =
                 *(ulong *)&r->field_0x460 & 0xffffffffffff0000 |
                 (ulong)(((uint)*(undefined8 *)&r->field_0x460 & 0xffff) + 1) & 0xffff;
            *(ulong *)&r->field_0x468 = *(ulong *)&r->field_0x468 & 0xffffffffffffefff | 0x1000;
            r_local = (ngx_http_request_t *)0x0;
          }
          else {
            r_local = (ngx_http_request_t *)0x1f4;
          }
        }
      }
    }
    else {
      r_local = (ngx_http_request_t *)0x1f4;
    }
  }
  else {
    r_local = (ngx_http_request_t *)0x0;
  }
  return (ngx_int_t)r_local;
}

Assistant:

ngx_int_t
ngx_http_discard_request_body(ngx_http_request_t *r)
{
    ssize_t       size;
    ngx_int_t     rc;
    ngx_event_t  *rev;

    if (r != r->main || r->discard_body || r->request_body) {
        return NGX_OK;
    }

#if (NGX_HTTP_V2)
    if (r->stream) {
        r->stream->skip_data = 1;
        return NGX_OK;
    }
#endif

    if (ngx_http_test_expect(r) != NGX_OK) {
        return NGX_HTTP_INTERNAL_SERVER_ERROR;
    }

    rev = r->connection->read;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, rev->log, 0, "http set discard body");

    if (rev->timer_set) {
        ngx_del_timer(rev);
    }

    if (r->headers_in.content_length_n <= 0 && !r->headers_in.chunked) {
        return NGX_OK;
    }

    size = r->header_in->last - r->header_in->pos;

    if (size || r->headers_in.chunked) {
        rc = ngx_http_discard_request_body_filter(r, r->header_in);

        if (rc != NGX_OK) {
            return rc;
        }

        if (r->headers_in.content_length_n == 0) {
            return NGX_OK;
        }
    }

    rc = ngx_http_read_discarded_request_body(r);

    if (rc == NGX_OK) {
        r->lingering_close = 0;
        return NGX_OK;
    }

    if (rc >= NGX_HTTP_SPECIAL_RESPONSE) {
        return rc;
    }

    /* rc == NGX_AGAIN */

    r->read_event_handler = ngx_http_discarded_request_body_handler;

    if (ngx_handle_read_event(rev, 0) != NGX_OK) {
        return NGX_HTTP_INTERNAL_SERVER_ERROR;
    }

    r->count++;
    r->discard_body = 1;

    return NGX_OK;
}